

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asio_service.cxx
# Opt level: O0

void __thiscall nuraft::asio_service::asio_service(asio_service *this,options *_opt,ptr<logger> *_l)

{
  _func_int **pp_Var1;
  shared_ptr<nuraft::logger> *in_RSI;
  delayed_task_scheduler *in_RDI;
  ptr<logger> *in_stack_000001e0;
  options *in_stack_000001e8;
  asio_service_impl *in_stack_000001f0;
  shared_ptr<nuraft::logger> *in_stack_ffffffffffffff88;
  
  delayed_task_scheduler::delayed_task_scheduler(in_RDI);
  rpc_client_factory::rpc_client_factory((rpc_client_factory *)(in_RDI + 1));
  in_RDI->_vptr_delayed_task_scheduler = (_func_int **)&PTR__asio_service_006a8de0;
  in_RDI[1]._vptr_delayed_task_scheduler = (_func_int **)&PTR__asio_service_006a8e18;
  pp_Var1 = (_func_int **)operator_new(0x348);
  std::shared_ptr<nuraft::logger>::shared_ptr(in_RSI,in_stack_ffffffffffffff88);
  asio_service_impl::asio_service_impl(in_stack_000001f0,in_stack_000001e8,in_stack_000001e0);
  std::shared_ptr<nuraft::logger>::~shared_ptr((shared_ptr<nuraft::logger> *)0x184457);
  in_RDI[2]._vptr_delayed_task_scheduler = pp_Var1;
  std::shared_ptr<nuraft::logger>::shared_ptr(in_RSI,in_stack_ffffffffffffff88);
  return;
}

Assistant:

asio_service::asio_service(const options& _opt, ptr<logger> _l)
    : impl_(new asio_service_impl(_opt, _l))
    , l_(_l)
    {}